

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::SetCurrentFont(ImFont *font)

{
  ImGuiWindow *pIVar1;
  ImFontAtlas *pIVar2;
  undefined1 auVar3 [16];
  ImGuiContext *pIVar4;
  ImGuiContext *g;
  float fVar5;
  
  pIVar4 = GImGui;
  GImGui->Font = font;
  auVar3 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),
                      ZEXT416((uint)((pIVar4->IO).FontGlobalScale * font->FontSize * font->Scale)));
  pIVar4->FontBaseSize = auVar3._0_4_;
  pIVar1 = pIVar4->CurrentWindow;
  if (pIVar1 == (ImGuiWindow *)0x0) {
    fVar5 = 0.0;
  }
  else {
    fVar5 = auVar3._0_4_ * pIVar1->FontWindowScale;
    if (pIVar1->ParentWindow != (ImGuiWindow *)0x0) {
      fVar5 = fVar5 * pIVar1->ParentWindow->FontWindowScale;
    }
  }
  pIVar4->FontSize = fVar5;
  pIVar2 = font->ContainerAtlas;
  (pIVar4->DrawListSharedData).TexUvWhitePixel = pIVar2->TexUvWhitePixel;
  (pIVar4->DrawListSharedData).TexUvLines = pIVar2->TexUvLines;
  (pIVar4->DrawListSharedData).Font = font;
  (pIVar4->DrawListSharedData).FontSize = fVar5;
  return;
}

Assistant:

void ImGui::SetCurrentFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(font && font->IsLoaded());    // Font Atlas not created. Did you call io.Fonts->GetTexDataAsRGBA32 / GetTexDataAsAlpha8 ?
    IM_ASSERT(font->Scale > 0.0f);
    g.Font = font;
    g.FontBaseSize = ImMax(1.0f, g.IO.FontGlobalScale * g.Font->FontSize * g.Font->Scale);
    g.FontSize = g.CurrentWindow ? g.CurrentWindow->CalcFontSize() : 0.0f;

    ImFontAtlas* atlas = g.Font->ContainerAtlas;
    g.DrawListSharedData.TexUvWhitePixel = atlas->TexUvWhitePixel;
    g.DrawListSharedData.TexUvLines = atlas->TexUvLines;
    g.DrawListSharedData.Font = g.Font;
    g.DrawListSharedData.FontSize = g.FontSize;
}